

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAndAbs.c
# Opt level: O2

DdNode * Cudd_bddAndAbstract(DdManager *manager,DdNode *f,DdNode *g,DdNode *cube)

{
  DdNode *pDVar1;
  
  do {
    manager->reordered = 0;
    pDVar1 = cuddBddAndAbstractRecur(manager,f,g,cube);
  } while (manager->reordered == 1);
  return pDVar1;
}

Assistant:

DdNode *
Cudd_bddAndAbstract(
  DdManager * manager,
  DdNode * f,
  DdNode * g,
  DdNode * cube)
{
    DdNode *res;

    do {
        manager->reordered = 0;
        res = cuddBddAndAbstractRecur(manager, f, g, cube);
    } while (manager->reordered == 1);
    return(res);

}